

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O1

void pgraph_dump_celsius_pipe(int cnum,pgraph_state *state)

{
  bool bVar1;
  void *pvVar2;
  int i_16;
  int i_4;
  int iVar3;
  uint32_t (*pauVar4) [16];
  uint32_t (*pauVar5) [4];
  uint32_t (*pauVar6) [3];
  int i;
  long lVar7;
  long lVar8;
  uint32_t addr;
  uint32_t word;
  uint32_t vtx [20];
  uint32_t local_90;
  int local_8c;
  uint32_t auStack_88 [22];
  
  pvVar2 = nva_cards[cnum]->bar0;
  *(undefined4 *)((long)pvVar2 + 0x40014c) = 0x56;
  bVar1 = state->celsius_pipe_broke_ovtx;
  if (bVar1 == true) {
    *(undefined4 *)((long)pvVar2 + 0x400f50) = 0x4470;
    lVar7 = 0;
    do {
      state->celsius_pipe_junk[lVar7] = *(uint32_t *)((long)pvVar2 + 0x400f54);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
  }
  pauVar4 = state->celsius_pipe_ovtx;
  lVar7 = 0;
  do {
    *(int *)((long)pvVar2 + 0x400f50) = (int)lVar7 * 0x40 + 0x800;
    lVar8 = 0;
    do {
      (*pauVar4)[lVar8] = *(uint32_t *)((long)pvVar2 + 0x400f54);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
    lVar7 = lVar7 + 1;
    pauVar4 = pauVar4 + 1;
  } while (lVar7 != 0x10);
  *(undefined4 *)((long)pvVar2 + 0x400f50) = 0x4400;
  lVar7 = 0;
  do {
    state->celsius_pipe_vtx[lVar7] = *(uint32_t *)((long)pvVar2 + 0x400f54);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1c);
  if (bVar1 == false) {
    *(undefined4 *)((long)pvVar2 + 0x400f50) = 0x4470;
    lVar7 = 0;
    do {
      state->celsius_pipe_junk[lVar7] = *(uint32_t *)((long)pvVar2 + 0x400f54);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
  }
  pauVar4 = state->celsius_pipe_xvtx;
  lVar7 = 0;
  do {
    *(int *)((long)pvVar2 + 0x400f50) = (int)lVar7 * 0x40 + 0x200;
    lVar8 = 0;
    do {
      (*pauVar4)[lVar8] = *(uint32_t *)((long)pvVar2 + 0x400f54);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
    lVar7 = lVar7 + 1;
    pauVar4 = pauVar4 + 1;
  } while (lVar7 != 3);
  pauVar5 = state->celsius_pipe_xfrm;
  lVar7 = 0;
  do {
    *(int *)((long)pvVar2 + 0x400f50) = (int)lVar7 * 0x10 + 0x6400;
    lVar8 = 0;
    do {
      (*pauVar5)[lVar8] = *(uint32_t *)((long)pvVar2 + 0x400f54);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar7 = lVar7 + 1;
    pauVar5 = pauVar5 + 1;
  } while (lVar7 != 0x3c);
  pauVar6 = state->celsius_pipe_light_v;
  lVar7 = 0;
  do {
    *(int *)((long)pvVar2 + 0x400f50) = (int)lVar7 * 0x10 + 0x6800;
    lVar8 = 0;
    do {
      (*pauVar6)[lVar8] = *(uint32_t *)((long)pvVar2 + 0x400f54);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar7 = lVar7 + 1;
    pauVar6 = pauVar6 + 1;
  } while (lVar7 != 0x30);
  iVar3 = 0x6c00;
  lVar7 = 0;
  do {
    *(int *)((long)pvVar2 + 0x400f50) = iVar3;
    state->celsius_pipe_light_sa[lVar7] = *(uint32_t *)((long)pvVar2 + 0x400f54);
    lVar7 = lVar7 + 1;
    iVar3 = iVar3 + 0x10;
  } while (lVar7 != 3);
  iVar3 = 0x7000;
  lVar7 = 0;
  do {
    *(int *)((long)pvVar2 + 0x400f50) = iVar3;
    state->celsius_pipe_light_sb[lVar7] = *(uint32_t *)((long)pvVar2 + 0x400f54);
    lVar7 = lVar7 + 1;
    iVar3 = iVar3 + 0x10;
  } while (lVar7 != 0x13);
  iVar3 = 0x7400;
  lVar7 = 0;
  do {
    *(int *)((long)pvVar2 + 0x400f50) = iVar3;
    state->celsius_pipe_light_sc[lVar7] = *(uint32_t *)((long)pvVar2 + 0x400f54);
    lVar7 = lVar7 + 1;
    iVar3 = iVar3 + 0x10;
  } while (lVar7 != 0xc);
  iVar3 = 0x7800;
  lVar7 = 0;
  do {
    *(int *)((long)pvVar2 + 0x400f50) = iVar3;
    state->celsius_pipe_light_sd[lVar7] = *(uint32_t *)((long)pvVar2 + 0x400f54);
    lVar7 = lVar7 + 1;
    iVar3 = iVar3 + 0x10;
  } while (lVar7 != 0xc);
  *(undefined4 *)((long)pvVar2 + 0x400f50) = 0;
  lVar7 = 0;
  do {
    auStack_88[lVar7] = *(uint32_t *)((long)pvVar2 + 0x400f54);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x14);
  lVar7 = 0;
  do {
    state->celsius_pipe_vtxbuf_offset[lVar7] = auStack_88[lVar7 * 2];
    state->celsius_pipe_vtxbuf_format[lVar7] = auStack_88[lVar7 * 2 + 1];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  state->celsius_pipe_begin_end = auStack_88[0x10];
  state->celsius_pipe_edge_flag = auStack_88[0x11];
  state->celsius_pipe_unk48 = auStack_88[0x12];
  state->celsius_pipe_vtx_state = auStack_88[0x13];
  if ((state->chipset).chipset == 0x10) {
    addr = 0x3c;
    lVar7 = 0;
    local_8c = cnum;
    do {
      local_90 = 0;
      pgraph_load_pipe(cnum,4,&local_90,1);
      pvVar2 = nva_cards[cnum]->bar0;
      *(undefined4 *)((long)pvVar2 + 0x400f50) = 0x4c;
      if (lVar7 + 7U != (ulong)(*(uint *)((long)pvVar2 + 0x400f54) & 0x1f)) {
        *(byte *)(state->celsius_pipe_vtxbuf_format + lVar7 + 7) =
             (byte)state->celsius_pipe_vtxbuf_format[lVar7 + 7] & 0x8f;
      }
      local_90 = 0;
      pgraph_load_pipe(local_8c,addr,&local_90,1);
      addr = addr - 8;
      lVar7 = lVar7 + -1;
    } while (lVar7 != -7);
  }
  return;
}

Assistant:

void pgraph_dump_celsius_pipe(int cnum, struct pgraph_state *state) {
	nva_wr32(cnum, 0x40014c, 0x00000056);
	if (state->celsius_pipe_broke_ovtx)
		pgraph_dump_pipe(cnum, 0x4470, state->celsius_pipe_junk, 4);
	for (int i = 0; i < 0x10; i++)
		pgraph_dump_pipe(cnum, 0x0800 + i * 0x40, state->celsius_pipe_ovtx[i], 0x10);
	pgraph_dump_pipe(cnum, 0x4400, state->celsius_pipe_vtx, 0x1c);
	if (!state->celsius_pipe_broke_ovtx)
		pgraph_dump_pipe(cnum, 0x4470, state->celsius_pipe_junk, 4);
	for (int i = 0; i < 3; i++)
		pgraph_dump_pipe(cnum, 0x0200 + i * 0x40, state->celsius_pipe_xvtx[i], 0x10);
	for (int i = 0; i < 0x3c; i++) {
		pgraph_dump_pipe(cnum, 0x6400 + i * 0x10, state->celsius_pipe_xfrm[i], 4);
	}
	for (int i = 0; i < 0x30; i++) {
		pgraph_dump_pipe(cnum, 0x6800 + i * 0x10, state->celsius_pipe_light_v[i], 3);
	}
	for (int i = 0; i < 3; i++) {
		pgraph_dump_pipe(cnum, 0x6c00 + i * 0x10, state->celsius_pipe_light_sa + i, 1);
	}
	for (int i = 0; i < 19; i++) {
		pgraph_dump_pipe(cnum, 0x7000 + i * 0x10, state->celsius_pipe_light_sb + i, 1);
	}
	for (int i = 0; i < 12; i++) {
		pgraph_dump_pipe(cnum, 0x7400 + i * 0x10, state->celsius_pipe_light_sc + i, 1);
	}
	for (int i = 0; i < 12; i++) {
		pgraph_dump_pipe(cnum, 0x7800 + i * 0x10, state->celsius_pipe_light_sd + i, 1);
	}
	uint32_t vtx[20];
	pgraph_dump_pipe(cnum, 0x0000, vtx, 20);
	for (int i = 0; i < 8; i++) {
		state->celsius_pipe_vtxbuf_offset[i] = vtx[2*i];
		state->celsius_pipe_vtxbuf_format[i] = vtx[2*i+1];
	}
	state->celsius_pipe_begin_end = vtx[16];
	state->celsius_pipe_edge_flag = vtx[17];
	state->celsius_pipe_unk48 = vtx[18];
	state->celsius_pipe_vtx_state = vtx[19];
	if (state->chipset.chipset == 0x10) {
		// Fuck me with a chainsaw.  On NV10, vtxbuf_format readout is broken in
		// two ways:
		//
		// 1. If component count is 0 (ie. a vtxbuf is disabled), it reads as some
		//    non-zero value depending on the attribute instead.
		// 2. Bit 2 of format of attribute 2 (ie. secondary color) comes from
		//    attribute 1 (primary color) instead.
		//
		// Work around #1 by observing the last active attribute in vtx_state.
		for (unsigned i = 7; i > 0; i--) {
			uint32_t word = 0;
			pgraph_load_pipe(cnum, 4, &word, 1);
			pgraph_dump_pipe(cnum, 0x4c, &word, 1);
			if (extr(word, 0, 5) != i)
				insrt(state->celsius_pipe_vtxbuf_format[i], 4, 3, 0);
			word = 0;
			pgraph_load_pipe(cnum, i*8+4, &word, 1);
		}
	}
}